

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

bool __thiscall phosg::BitmapImage::read_pixel(BitmapImage *this,size_t x,size_t y)

{
  out_of_range *this_00;
  
  if ((x < this->width) && (y < this->height)) {
    return (bool)((byte)(this->data[(x >> 3) + y * this->row_bytes] << ((byte)x & 7)) >> 7);
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  ::std::out_of_range::out_of_range(this_00,"out of bounds");
  __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
}

Assistant:

bool BitmapImage::read_pixel(size_t x, size_t y) const {
  if (x >= this->width || y >= this->height) {
    throw out_of_range("out of bounds");
  }
  return !!(this->data[y * this->row_bytes + (x >> 3)] & (0x80 >> (x & 7)));
}